

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O2

void dac_dsp(t_dac *x,t_signal **sp)

{
  long lVar1;
  t_int *ptVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  lVar1 = x->x_n;
  ptVar2 = x->x_vec;
  for (lVar5 = 0; lVar1 != lVar5; lVar5 = lVar5 + 1) {
    if (sp[lVar5]->s_n == 0x40) {
      iVar4 = (int)ptVar2[lVar5] + -1;
      if (-1 < iVar4) {
        iVar3 = sys_get_outchannels();
        if (iVar4 < iVar3) {
          dsp_add(plus_perform,4,(pd_maininstance.pd_stuff)->st_soundout + (uint)(iVar4 * 0x40),
                  sp[lVar5]->s_vec,(pd_maininstance.pd_stuff)->st_soundout + (uint)(iVar4 * 0x40),
                  0x40);
        }
      }
    }
    else {
      pd_error((void *)0x0,"dac~: bad vector size");
    }
  }
  return;
}

Assistant:

static void dac_dsp(t_dac *x, t_signal **sp)
{
    t_int i, *ip;
    t_signal **sp2;
    for (i = x->x_n, ip = x->x_vec, sp2 = sp; i--; ip++, sp2++)
    {
        int ch = (int)(*ip - 1);
        if ((*sp2)->s_n != DEFDACBLKSIZE)
            pd_error(0, "dac~: bad vector size");
        else if (ch >= 0 && ch < sys_get_outchannels())
            dsp_add(plus_perform, 4, STUFF->st_soundout + DEFDACBLKSIZE*ch,
                (*sp2)->s_vec, STUFF->st_soundout + DEFDACBLKSIZE*ch, (t_int)DEFDACBLKSIZE);
    }
}